

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotScatterEx<ImPlot::GetterYs<unsigned_short>>
               (char *label_id,GetterYs<unsigned_short> *getter)

{
  TransformerLinLin transformer;
  ImPlotContext *pIVar1;
  bool bVar2;
  ImU32 col_mk_line;
  ImU32 col_mk_fill;
  ImDrawList *DrawList;
  int i;
  int iVar3;
  ImPlotMarker marker;
  ImPlotPoint p;
  
  bVar2 = BeginItem(label_id,2);
  if (!bVar2) {
    return;
  }
  if (GImPlot->FitThisFrame == true) {
    for (iVar3 = 0; iVar3 < getter->Count; iVar3 = iVar3 + 1) {
      p = GetterYs<unsigned_short>::operator()(getter,iVar3);
      FitPoint(&p);
    }
  }
  pIVar1 = GImPlot;
  DrawList = GetPlotDrawList();
  iVar3 = (pIVar1->NextItemData).Marker;
  marker = 0;
  if (iVar3 != -1) {
    marker = iVar3;
  }
  PopPlotClipRect();
  PushPlotClipRect((pIVar1->NextItemData).MarkerSize);
  col_mk_line = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 2);
  col_mk_fill = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 3);
  transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
  switch(GImPlot->Scales[transformer.YAxis]) {
  case 0:
    RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<unsigned_short>>
              (*getter,transformer,DrawList,marker,(pIVar1->NextItemData).MarkerSize,
               (pIVar1->NextItemData).RenderMarkerLine,col_mk_line,
               (pIVar1->NextItemData).MarkerWeight,(pIVar1->NextItemData).RenderMarkerFill,
               col_mk_fill);
    break;
  case 1:
    RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<unsigned_short>>
              (*getter,(TransformerLogLin)transformer.YAxis,DrawList,marker,
               (pIVar1->NextItemData).MarkerSize,(pIVar1->NextItemData).RenderMarkerLine,col_mk_line
               ,(pIVar1->NextItemData).MarkerWeight,(pIVar1->NextItemData).RenderMarkerFill,
               col_mk_fill);
    break;
  case 2:
    RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<unsigned_short>>
              (*getter,(TransformerLinLog)transformer.YAxis,DrawList,marker,
               (pIVar1->NextItemData).MarkerSize,(pIVar1->NextItemData).RenderMarkerLine,col_mk_line
               ,(pIVar1->NextItemData).MarkerWeight,(pIVar1->NextItemData).RenderMarkerFill,
               col_mk_fill);
    break;
  case 3:
    RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_short>>
              (*getter,(TransformerLogLog)transformer.YAxis,DrawList,marker,
               (pIVar1->NextItemData).MarkerSize,(pIVar1->NextItemData).RenderMarkerLine,col_mk_line
               ,(pIVar1->NextItemData).MarkerWeight,(pIVar1->NextItemData).RenderMarkerFill,
               col_mk_fill);
  }
  EndItem();
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}